

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall cmDebugger_impl::ClearAllBreakpoints(cmDebugger_impl *this)

{
  std::mutex::lock(&this->breakpointMutex);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::clear(&this->breakpoints);
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return;
}

Assistant:

void ClearAllBreakpoints() override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    breakpoints.clear();
  }